

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

int Gia_IsoSort(Gia_IsoMan_t *p)

{
  Gia_Man_t *pGVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  bool bVar4;
  int iVar5;
  int nSize_00;
  uint uVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  abctime aVar10;
  abctime aVar11;
  Vec_Int_t *t;
  abctime clk;
  int fRefined;
  int nSizeNew;
  int nSize;
  int iBeginOld;
  int iBegin;
  int fSameValue;
  int k;
  int i;
  Gia_Obj_t *pObj0;
  Gia_Obj_t *pObj;
  Gia_IsoMan_t *p_local;
  
  clk._0_4_ = 0;
  p->nSingles = 0;
  Vec_IntClear(p->vClasses2);
  fSameValue = 0;
  while( true ) {
    iVar5 = Vec_IntSize(p->vClasses);
    if (iVar5 <= fSameValue + 1) {
      pVVar3 = p->vClasses;
      p->vClasses = p->vClasses2;
      p->vClasses2 = pVVar3;
      p->nEntries = p->nEntries - p->nSingles;
      return (int)clk;
    }
    iVar5 = Vec_IntEntry(p->vClasses,fSameValue);
    nSize_00 = Vec_IntEntry(p->vClasses,fSameValue + 1);
    if (nSize_00 < 2) break;
    bVar4 = true;
    pGVar1 = p->pGia;
    uVar6 = Gia_IsoGetItem(p,iVar5);
    pGVar8 = Gia_ManObj(pGVar1,uVar6);
    for (iBegin = 0; iBegin < nSize_00; iBegin = iBegin + 1) {
      pGVar1 = p->pGia;
      uVar6 = Gia_IsoGetItem(p,iVar5 + iBegin);
      pGVar9 = Gia_ManObj(pGVar1,uVar6);
      Gia_IsoSetValue(p,iVar5 + iBegin,pGVar9->Value);
      if (pGVar9->Value != pGVar8->Value) {
        bVar4 = false;
      }
    }
    if (bVar4) {
      Vec_IntPush(p->vClasses2,iVar5);
      Vec_IntPush(p->vClasses2,nSize_00);
    }
    else {
      clk._0_4_ = 1;
      aVar10 = Abc_Clock();
      Abc_QuickSort3(p->pStoreW + iVar5,nSize_00,0);
      aVar11 = Abc_Clock();
      p->timeSort = (aVar11 - aVar10) + p->timeSort;
      pGVar1 = p->pGia;
      uVar6 = Gia_IsoGetItem(p,iVar5);
      _k = Gia_ManObj(pGVar1,uVar6);
      nSizeNew = iVar5;
      for (iBegin = 1; iBegin < nSize_00; iBegin = iBegin + 1) {
        pGVar1 = p->pGia;
        uVar6 = Gia_IsoGetItem(p,iVar5 + iBegin);
        pGVar8 = Gia_ManObj(pGVar1,uVar6);
        if (_k->Value != pGVar8->Value) {
          iVar7 = (iVar5 + iBegin) - nSizeNew;
          if (iVar7 == 1) {
            piVar2 = p->pUniques;
            uVar6 = Gia_IsoGetItem(p,nSizeNew);
            if (piVar2[uVar6] != 0) {
              __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                            ,0x157,"int Gia_IsoSort(Gia_IsoMan_t *)");
            }
            iVar7 = p->nUniques;
            p->nUniques = iVar7 + 1;
            piVar2 = p->pUniques;
            uVar6 = Gia_IsoGetItem(p,nSizeNew);
            piVar2[uVar6] = iVar7;
            p->nSingles = p->nSingles + 1;
          }
          else {
            Vec_IntPush(p->vClasses2,nSizeNew);
            Vec_IntPush(p->vClasses2,iVar7);
          }
          nSizeNew = iVar5 + iBegin;
          _k = pGVar8;
        }
      }
      iVar5 = (iVar5 + iBegin) - nSizeNew;
      if (iVar5 == 1) {
        piVar2 = p->pUniques;
        uVar6 = Gia_IsoGetItem(p,nSizeNew);
        if (piVar2[uVar6] != 0) {
          __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                        ,0x167,"int Gia_IsoSort(Gia_IsoMan_t *)");
        }
        iVar5 = p->nUniques;
        p->nUniques = iVar5 + 1;
        piVar2 = p->pUniques;
        uVar6 = Gia_IsoGetItem(p,nSizeNew);
        piVar2[uVar6] = iVar5;
        p->nSingles = p->nSingles + 1;
      }
      else {
        Vec_IntPush(p->vClasses2,nSizeNew);
        Vec_IntPush(p->vClasses2,iVar5);
      }
    }
    fSameValue = fSameValue + 2;
  }
  __assert_fail("nSize > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                ,0x137,"int Gia_IsoSort(Gia_IsoMan_t *)");
}

Assistant:

int Gia_IsoSort( Gia_IsoMan_t * p )
{
    Gia_Obj_t * pObj, * pObj0;
    int i, k, fSameValue, iBegin, iBeginOld, nSize, nSizeNew;
    int fRefined = 0;
    abctime clk;

    // go through the equiv classes
    p->nSingles = 0;
    Vec_IntClear( p->vClasses2 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        assert( nSize > 1 );
        fSameValue = 1;
        pObj0 = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin) );
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            Gia_IsoSetValue( p, iBegin+k, pObj->Value );
            if ( pObj->Value != pObj0->Value )
                fSameValue = 0;
        }
        if ( fSameValue )
        {
            Vec_IntPush( p->vClasses2, iBegin );
            Vec_IntPush( p->vClasses2, nSize );
            continue;
        }
        fRefined = 1;
        // sort objects
        clk = Abc_Clock();
        Abc_QuickSort3( p->pStoreW + iBegin, nSize, 0 );
        p->timeSort += Abc_Clock() - clk;
        // divide into new classes
        iBeginOld = iBegin;
        pObj0 = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin) );
        for ( k = 1; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            if ( pObj0->Value == pObj->Value )
                continue;
            nSizeNew = iBegin + k - iBeginOld;
            if ( nSizeNew == 1 )
            {
                assert( p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0 );
                p->pUniques[Gia_IsoGetItem(p, iBeginOld)] = p->nUniques++;
                p->nSingles++;
            }
            else
            {
                Vec_IntPush( p->vClasses2, iBeginOld );
                Vec_IntPush( p->vClasses2, nSizeNew );
            }
            iBeginOld = iBegin + k;
            pObj0 = pObj;
        }
        // add the last one
        nSizeNew = iBegin + k - iBeginOld;
        if ( nSizeNew == 1 )
        {
            assert( p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0 );
            p->pUniques[Gia_IsoGetItem(p, iBeginOld)] = p->nUniques++;
            p->nSingles++;
        }
        else
        {
            Vec_IntPush( p->vClasses2, iBeginOld );
            Vec_IntPush( p->vClasses2, nSizeNew );
        }
    }

    ABC_SWAP( Vec_Int_t *, p->vClasses, p->vClasses2 );
    p->nEntries -= p->nSingles;
    return fRefined;
}